

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLoadXYZROTnode::ComputeQ
          (ChLoadXYZROTnode *this,ChState *state_x,ChStateDelta *state_w)

{
  ChVector<double> *pCVar1;
  double dVar2;
  element_type *peVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  uint uVar8;
  long *plVar9;
  long lVar10;
  Index index;
  ulong uVar11;
  ulong uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ChFrameMoving<double> bodycoordA;
  ChCoordsys<double> local_190;
  ChVector<double> local_158;
  ChState *local_140;
  undefined8 local_138;
  long local_128;
  ChFrameMoving<double> local_120;
  
  peVar3 = (this->super_ChLoadCustom).loadable.
           super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    plVar9 = (long *)0x0;
  }
  else {
    plVar9 = (long *)__dynamic_cast(peVar3,&ChLoadable::typeinfo,&ChNodeFEAxyzrot::typeinfo,
                                    0xffffffffffffffff);
  }
  if (plVar9 == (long *)0x0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    plVar9 = (long *)0x0;
  }
  else {
    this_00 = (this->super_ChLoadCustom).loadable.
              super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  lVar10 = (**(code **)(*plVar9 + 0x40))(plVar9);
  if (*(char *)(lVar10 + 0x2c) != '\0') {
LAB_0064f21f:
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    return;
  }
  local_158.m_data[2] = 0.0;
  local_158.m_data[0] = 0.0;
  local_158.m_data[1] = 0.0;
  local_190.pos.m_data[0] = 1.0;
  local_190.pos.m_data[1] = 0.0;
  local_190.pos.m_data[2] = 0.0;
  local_190.rot.m_data[0] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&local_120,&local_158,(ChQuaternion<double> *)&local_190);
  if (state_x == (ChState *)0x0) {
    ChFrame<double>::SetCoord(&local_120.super_ChFrame<double>,(ChCoordsys<double> *)(plVar9 + 4));
  }
  else {
    local_158.m_data[0] =
         (double)(state_x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_128 = (state_x->super_ChVectorDynamic<double>).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_158.m_data[1] = 3.45845952088873e-323;
    local_138 = 0;
    local_140 = state_x;
    if (local_128 < 7) goto LAB_0064f23d;
    ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              (&local_190,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_158,(type *)0x0);
    ChFrame<double>::SetCoord(&local_120.super_ChFrame<double>,&local_190);
  }
  if (state_w == (ChStateDelta *)0x0) {
    if (&local_120.coord_dt != (ChCoordsys<double> *)(plVar9 + 0x14)) {
      local_120.coord_dt.pos.m_data[0] = (double)plVar9[0x14];
      local_120.coord_dt.pos.m_data[1] = (double)plVar9[0x15];
      local_120.coord_dt.pos.m_data[2] = (double)plVar9[0x16];
      local_120.coord_dt.rot.m_data[0] = (double)plVar9[0x17];
      local_120.coord_dt.rot.m_data[1] = (double)plVar9[0x18];
      local_120.coord_dt.rot.m_data[2] = (double)plVar9[0x19];
      local_120.coord_dt.rot.m_data[3] = (double)plVar9[0x1a];
    }
  }
  else {
    local_190.pos.m_data[0] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_190.rot.m_data[3] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_190.pos.m_data[1] = 1.48219693752374e-323;
    local_190.rot.m_data[1] = 0.0;
    local_190.rot.m_data[0] = (double)state_w;
    if ((long)local_190.rot.m_data[3] < 3) goto LAB_0064f23d;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              (&local_158,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_190,(type *)0x0);
    local_120.coord_dt.pos.m_data[0] = local_158.m_data[0];
    local_120.coord_dt.pos.m_data[1] = local_158.m_data[1];
    local_120.coord_dt.pos.m_data[2] = local_158.m_data[2];
    local_190.rot.m_data[3] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_190.pos.m_data[0] =
         (double)((state_w->super_ChVectorDynamic<double>).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 3);
    local_190.pos.m_data[1] = 1.48219693752374e-323;
    local_190.rot.m_data[1] = 1.48219693752374e-323;
    local_190.rot.m_data[0] = (double)state_w;
    if ((long)local_190.rot.m_data[3] < 6) goto LAB_0064f23d;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              (&local_158,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_190,(type *)0x0);
    ChFrameMoving<double>::SetWvel_loc(&local_120,&local_158);
  }
  pCVar1 = &this->computed_abs_force;
  (*(this->super_ChLoadCustom).super_ChLoadBase.super_ChObj._vptr_ChObj[0x16])
            (this,&local_120,pCVar1,&this->computed_abs_torque);
  if (2 < (this->super_ChLoadCustom).load_Q.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    pdVar4 = (this->super_ChLoadCustom).load_Q.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    uVar11 = 3;
    if ((((ulong)pdVar4 & 7) == 0) &&
       (uVar12 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar12 < 3)) {
      uVar11 = uVar12;
    }
    if (uVar11 != 0) {
      uVar12 = 0;
      do {
        pdVar4[uVar12] = pCVar1->m_data[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
    if (uVar11 < 3) {
      do {
        pdVar4[uVar11] = pCVar1->m_data[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar11 != 3);
    }
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_120.super_ChFrame<double>.coord.rot.m_data[0];
    local_120.super_ChFrame<double>.coord.rot.m_data[0] =
         local_120.super_ChFrame<double>.coord.rot.m_data[0] *
         local_120.super_ChFrame<double>.coord.rot.m_data[0];
    auVar14._8_8_ = 0x8000000000000000;
    auVar14._0_8_ = 0x8000000000000000;
    auVar14 = vxorpd_avx512vl(auVar16,auVar14);
    dVar15 = auVar14._0_8_;
    auVar26 = ZEXT816(0xbff0000000000000);
    auVar27 = ZEXT816(0x4000000000000000);
    auVar21._8_8_ = 0;
    auVar21._0_8_ =
         local_120.super_ChFrame<double>.coord.rot.m_data[0] +
         local_120.super_ChFrame<double>.coord.rot.m_data[1] *
         local_120.super_ChFrame<double>.coord.rot.m_data[1];
    auVar14 = vfmadd213sd_fma(auVar21,auVar27,auVar26);
    dVar6 = local_120.super_ChFrame<double>.coord.rot.m_data[1] *
            local_120.super_ChFrame<double>.coord.rot.m_data[2] -
            local_120.super_ChFrame<double>.coord.rot.m_data[3] * dVar15;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = (this->computed_abs_torque).m_data[0];
    dVar2 = (this->computed_abs_torque).m_data[1];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar2 * (dVar6 + dVar6);
    auVar14 = vfmadd231sd_fma(auVar28,auVar29,auVar14);
    dVar6 = local_120.super_ChFrame<double>.coord.rot.m_data[2] * dVar15 +
            local_120.super_ChFrame<double>.coord.rot.m_data[1] *
            local_120.super_ChFrame<double>.coord.rot.m_data[3];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = (this->computed_abs_torque).m_data[2];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar6 + dVar6;
    auVar14 = vfmadd213sd_fma(auVar22,auVar30,auVar14);
    dVar6 = local_120.super_ChFrame<double>.coord.rot.m_data[1] *
            local_120.super_ChFrame<double>.coord.rot.m_data[2] +
            local_120.super_ChFrame<double>.coord.rot.m_data[3] * dVar15;
    auVar24._8_8_ = 0;
    auVar24._0_8_ =
         local_120.super_ChFrame<double>.coord.rot.m_data[0] +
         local_120.super_ChFrame<double>.coord.rot.m_data[2] *
         local_120.super_ChFrame<double>.coord.rot.m_data[2];
    auVar16 = vfmadd213sd_fma(auVar24,auVar27,auVar26);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar6 + dVar6;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar2 * auVar16._0_8_;
    auVar16 = vfmadd231sd_fma(auVar25,auVar29,auVar17);
    dVar6 = local_120.super_ChFrame<double>.coord.rot.m_data[2] *
            local_120.super_ChFrame<double>.coord.rot.m_data[3] -
            local_120.super_ChFrame<double>.coord.rot.m_data[1] * dVar15;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar6 + dVar6;
    auVar16 = vfmadd213sd_fma(auVar18,auVar30,auVar16);
    dVar7 = local_120.super_ChFrame<double>.coord.rot.m_data[1] *
            local_120.super_ChFrame<double>.coord.rot.m_data[3] -
            local_120.super_ChFrame<double>.coord.rot.m_data[2] * dVar15;
    dVar6 = local_120.super_ChFrame<double>.coord.rot.m_data[1] * dVar15 +
            local_120.super_ChFrame<double>.coord.rot.m_data[2] *
            local_120.super_ChFrame<double>.coord.rot.m_data[3];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar7 + dVar7;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar2 * (dVar6 + dVar6);
    auVar18 = vfmadd231sd_fma(auVar23,auVar29,auVar19);
    auVar20._8_8_ = 0;
    auVar20._0_8_ =
         local_120.super_ChFrame<double>.coord.rot.m_data[0] +
         local_120.super_ChFrame<double>.coord.rot.m_data[3] *
         local_120.super_ChFrame<double>.coord.rot.m_data[3];
    auVar17 = vfmadd213sd_fma(auVar20,auVar27,auVar26);
    auVar17 = vfmadd213sd_fma(auVar17,auVar30,auVar18);
    local_190.pos.m_data[0] = auVar14._0_8_;
    local_190.pos.m_data[1] = auVar16._0_8_;
    local_190.pos.m_data[2] = auVar17._0_8_;
    if (5 < (this->super_ChLoadCustom).load_Q.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      pdVar5 = (this->super_ChLoadCustom).load_Q.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      pdVar4 = pdVar5 + 3;
      uVar13 = 3;
      if ((((ulong)pdVar4 & 7) == 0) &&
         (uVar8 = -((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7, uVar8 < 3)) {
        uVar13 = uVar8;
      }
      if (uVar13 != 0) {
        memcpy(pdVar4,&local_190,(ulong)(uVar13 * 8));
      }
      if (uVar13 < 3) {
        uVar11 = (ulong)(uVar13 << 3);
        memcpy((void *)((long)pdVar5 + uVar11 + 0x18),(void *)((long)local_190.pos.m_data + uVar11),
               0x18 - uVar11);
      }
      goto LAB_0064f21f;
    }
  }
LAB_0064f23d:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChLoadXYZROTnode::ComputeQ(ChState* state_x, ChStateDelta* state_w) {
    auto mnode = std::dynamic_pointer_cast<ChNodeFEAxyzrot>(this->loadable);
    if (!mnode->Variables().IsActive())
        return;

    ChFrameMoving<> bodycoordA;

    if (state_x) {
        // the numerical jacobian algo might change state_x
        bodycoordA.SetCoord(state_x->segment(0, 7));
    } else {
        bodycoordA.SetCoord(mnode->coord);
    }

    if (state_w) {
        // the numerical jacobian algo might change state_w
        bodycoordA.SetPos_dt(state_w->segment(0, 3));
        bodycoordA.SetWvel_loc(state_w->segment(3, 3));
    } else {
        bodycoordA.SetCoord_dt(mnode->GetCoord_dt());
    }

    ComputeForceTorque(bodycoordA, computed_abs_force, computed_abs_torque);

    // Compute Q
    load_Q.segment(0, 3) = computed_abs_force.eigen();
    load_Q.segment(3, 3) =
        (bodycoordA.coord.rot.RotateBack(computed_abs_torque)).eigen();  // because Q expect torque in local frame
}